

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

char * __thiscall
sentencepiece::ModelProto_SentencePiece::_InternalParse
          (ModelProto_SentencePiece *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  string *s;
  float *pfVar3;
  uint uVar4;
  int iVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 extraout_RDX_00;
  void *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *pfVar9;
  char cVar10;
  uint uVar11;
  uint uVar12;
  pair<const_char_*,_unsigned_int> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  float *local_48;
  InternalMetadata *local_40;
  ExtensionSet *local_38;
  
  local_48 = (float *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  uVar12 = 0;
  if (!bVar2) {
    local_40 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->_extensions_;
    uVar12 = 0;
    uVar6 = extraout_RDX;
    do {
      bVar1 = *(byte *)local_48;
      uVar11 = (uint)bVar1;
      pfVar9 = (float *)((long)local_48 + 1);
      if ((char)bVar1 < '\0') {
        uVar11 = ((uint)bVar1 + (uint)*(byte *)pfVar9 * 0x80) - 0x80;
        if (-1 < (char)*(byte *)pfVar9) {
          pfVar9 = (float *)((long)local_48 + 2);
          goto LAB_001b4557;
        }
        pVar13 = google::protobuf::internal::ReadTagFallback((char *)local_48,uVar11);
        local_48 = (float *)pVar13.first;
        if (local_48 != (float *)0x0) {
          uVar11 = pVar13.second;
          goto LAB_001b455b;
        }
LAB_001b4715:
        local_48 = (float *)0x0;
        break;
      }
LAB_001b4557:
      pVar13._8_8_ = uVar6;
      pVar13.first = (char *)pfVar9;
      local_48 = pfVar9;
LAB_001b455b:
      pfVar9 = (float *)pVar13.first;
      uVar4 = uVar11 >> 3;
      cVar10 = (char)uVar11;
      if (uVar4 == 3) {
        if (cVar10 != '\x18') goto LAB_001b461c;
        uVar7 = (ulong)(char)*(byte *)pfVar9;
        pfVar3 = (float *)((long)pfVar9 + 1);
        if ((long)uVar7 < 0) {
          uVar11 = ((uint)*(byte *)pfVar3 * 0x80 + (uint)*(byte *)pfVar9) - 0x80;
          if (-1 < (char)*(byte *)pfVar3) {
            uVar7 = (ulong)uVar11;
            pfVar3 = (float *)((long)pfVar9 + 2);
            goto LAB_001b4600;
          }
          pVar14 = google::protobuf::internal::VarintParseSlow64((char *)pfVar9,uVar11);
          iVar5 = (int)pVar14.second;
          local_48 = (float *)pVar14.first;
          if (local_48 == (float *)0x0) goto LAB_001b4715;
        }
        else {
LAB_001b4600:
          iVar5 = (int)uVar7;
          local_48 = pfVar3;
        }
        if (iVar5 - 1U < 6) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          this->type_ = iVar5;
        }
        else {
          _InternalParse();
        }
      }
      else if (uVar4 == 2) {
        if (cVar10 != '\x15') goto LAB_001b461c;
        uVar12 = 2;
        this->score_ = *pfVar9;
        local_48 = pfVar9 + 1;
      }
      else {
        if ((uVar4 == 1) && (cVar10 == '\n')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pvVar8 = (this->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pvVar8 & 1) != 0) {
            pvVar8 = *(void **)((ulong)pvVar8 & 0xfffffffffffffffe);
          }
          s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->piece_,pvVar8);
          local_48 = (float *)google::protobuf::internal::InlineGreedyStringParser
                                        (s,(char *)local_48,ctx);
        }
        else {
LAB_001b461c:
          if ((uVar11 == 0) || ((uVar11 & 7) == 4)) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar11 - 1;
            break;
          }
          if (uVar11 < 0x640) {
            if (((ulong)local_40->ptr_ & 1) == 0) {
              unknown = google::protobuf::internal::InternalMetadata::
                        mutable_unknown_fields_slow<std::__cxx11::string>(local_40);
              pfVar9 = local_48;
            }
            else {
              unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (((ulong)local_40->ptr_ & 0xfffffffffffffffe) + 8);
            }
            local_48 = (float *)google::protobuf::internal::UnknownFieldParse
                                          (uVar11,unknown,(char *)pfVar9,ctx);
          }
          else {
            local_48 = (float *)google::protobuf::internal::ExtensionSet::ParseField
                                          (local_38,(ulong)uVar11,(char *)pfVar9,
                                           (MessageLite *)
                                           _ModelProto_SentencePiece_default_instance_,local_40,ctx)
            ;
          }
        }
        if (local_48 == (float *)0x0) goto LAB_001b4715;
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
      uVar6 = extraout_RDX_00;
    } while (!bVar2);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar12;
  return (char *)local_48;
}

Assistant:

const char* ModelProto_SentencePiece::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string piece = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_piece();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional float score = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 21)) {
          _Internal::set_has_score(&has_bits);
          score_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::sentencepiece::ModelProto_SentencePiece_Type_IsValid(val))) {
            _internal_set_type(static_cast<::sentencepiece::ModelProto_SentencePiece_Type>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(3, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}